

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  bool bVar5;
  undefined8 uVar6;
  u8 uVar7;
  char cVar8;
  int iVar9;
  void *pvVar10;
  char c;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  undefined4 uVar19;
  DateTime x;
  DateTime y;
  DateTime y_1;
  DateTime local_f8;
  DateTime local_c8;
  sqlite3_str local_98;
  sqlite3_context *local_70;
  DateTime local_68;
  
  if (((argc != 0) &&
      (local_70 = context, pvVar10 = sqlite3ValueText(*argv,'\x01'), pvVar10 != (void *)0x0)) &&
     (iVar9 = isDate(local_70,argc + -1,argv + 1,&local_f8), iVar9 == 0)) {
    local_98.mxAlloc = local_70->pOut->db->aLimit[0];
    local_98.nAlloc = 0;
    local_98.db = (sqlite3 *)0x0;
    local_98.zText = (char *)0x0;
    local_98.nChar = 0;
    local_98.accError = '\0';
    local_98.printfFlags = '\0';
    computeJD(&local_f8);
    computeYMD(&local_f8);
    computeHMS(&local_f8);
    uVar18 = 0;
    uVar13 = 0;
    while( true ) {
      if (*(char *)((long)pvVar10 + uVar13) != '%') break;
      if (uVar18 < uVar13) {
        sqlite3_str_append(&local_98,(char *)((long)pvVar10 + uVar18),(int)uVar13 - (int)uVar18);
      }
      uVar6 = local_c8._40_8_;
      uVar12 = uVar13 + 1;
      cVar1 = *(char *)((long)pvVar10 + uVar13 + 1);
      uVar18 = uVar13 + 2;
      local_c8.validJD = local_f8.validJD;
      local_c8._40_8_ = uVar6;
      switch(cVar1) {
      case 'F':
        pcVar16 = "%04d-%02d-%02d";
        uVar11 = local_f8.M;
        uVar2 = local_f8.Y;
        uVar4 = local_f8.D;
        goto LAB_001a5316;
      case 'G':
      case 'g':
        local_c8.M = local_f8.M;
        local_c8.Y = local_f8.Y;
        local_c8.h = local_f8.h;
        local_c8.D = local_f8.D;
        local_c8.tz = local_f8.tz;
        local_c8.m = local_f8.m;
        local_c8.s = local_f8.s;
        iVar9 = (int)((local_f8.iJD + 43200000) / 86400000);
        local_c8.iJD = local_f8.iJD +
                       (int)((((uint)((ulong)((long)iVar9 * 0x92492493) >> 0x22) - (iVar9 >> 0x1f))
                              * 7 - iVar9) * 86400000 + 0xf731400);
        local_c8._42_6_ = SUB86(CONCAT44(local_f8._44_4_,local_f8._40_4_) >> 0x10,0);
        local_c8.validYMD = '\0';
        computeYMD(&local_c8);
        if (cVar1 == 'g') {
          pcVar16 = "%02d";
          uVar11 = local_c8.Y % 100;
        }
        else {
          pcVar16 = "%04d";
          uVar11 = local_c8.Y;
        }
        sqlite3_str_appendf(&local_98,pcVar16,(ulong)uVar11);
        goto LAB_001a54ad;
      case 'H':
      case 'k':
        pcVar16 = "%2d";
        if (cVar1 == 'H') {
          pcVar16 = "%02d";
        }
        uVar13 = (ulong)(uint)local_f8.h;
        break;
      case 'I':
      case 'l':
        uVar11 = local_f8.h - 0xc;
        if (local_f8.h < 0xd) {
          uVar11 = local_f8.h;
        }
        if (uVar11 == 0) {
          uVar11 = 0xc;
        }
        uVar13 = (ulong)uVar11;
        pcVar16 = "%2d";
        if (cVar1 == 'I') {
          pcVar16 = "%02d";
        }
        break;
      case 'J':
        uVar19 = SUB84((double)local_f8.iJD / 86400000.0,0);
        pcVar16 = "%.16g";
        goto LAB_001a54a6;
      case 'K':
      case 'L':
      case 'N':
      case 'O':
      case 'Q':
      case 'X':
      case 'Z':
      case '[':
      case '\\':
      case ']':
      case '^':
      case '_':
      case '`':
      case 'a':
      case 'b':
      case 'c':
      case 'h':
      case 'i':
      case 'n':
      case 'o':
      case 'q':
      case 'r':
      case 't':
      case 'v':
        goto switchD_001a4dd8_caseD_4b;
      case 'M':
        uVar13 = (ulong)(uint)local_f8.m;
        goto LAB_001a546c;
      case 'P':
      case 'p':
        if (local_f8.h < 0xc) {
          pcVar16 = "am";
          pcVar17 = "AM";
        }
        else {
          pcVar16 = "pm";
          pcVar17 = "PM";
        }
        if (cVar1 == 'p') {
          pcVar16 = pcVar17;
        }
        if (local_98.nChar + 2 < local_98.nAlloc) {
          *(undefined2 *)(local_98.zText + local_98.nChar) = *(undefined2 *)pcVar16;
          local_98.nChar = local_98.nChar + 2;
        }
        else {
          enlargeAndAppend(&local_98,pcVar16,2);
        }
        goto LAB_001a54ad;
      case 'R':
        bVar5 = false;
        sqlite3_str_appendf(&local_98,"%02d:%02d",(ulong)(uint)local_f8.h,(ulong)(uint)local_f8.m);
        goto LAB_001a54b2;
      case 'S':
        uVar13 = (ulong)(uint)(int)local_f8.s;
        goto LAB_001a546c;
      case 'T':
        pcVar16 = "%02d:%02d:%02d";
        uVar11 = local_f8.m;
        uVar2 = local_f8.h;
        uVar4 = (int)local_f8.s;
LAB_001a5316:
        bVar5 = false;
        sqlite3_str_appendf(&local_98,pcVar16,(ulong)uVar2,(ulong)uVar11,(ulong)uVar4);
        goto LAB_001a54b2;
      case 'U':
        local_c8.tz = local_f8.tz;
        local_c8.m = local_f8.m;
        local_c8.s = local_f8.s;
        local_c8.iJD = local_f8.iJD;
        local_c8._40_8_ = CONCAT44(local_f8._44_4_,local_f8._40_4_) & 0xffffffffffffff00;
        local_c8.M = 1;
        local_c8.Y = local_f8.Y;
        local_c8.h = local_f8.h;
        local_c8.D = 1;
        computeJD(&local_c8);
        auVar3 = SEXT816((local_f8.iJD - local_c8.iJD) + 43200000) * SEXT816(0x636ba875fd33dc87);
        iVar9 = (int)(auVar3._8_8_ >> 0x19) - (auVar3._12_4_ >> 0x1f);
        lVar15 = local_f8.iJD + 0x7b98a00;
        goto LAB_001a521b;
      case 'V':
        local_68.Y = local_f8.Y;
        local_68.h = local_f8.h;
        local_68.tz = local_f8.tz;
        local_68.m = local_f8.m;
        iVar9 = (int)((local_f8.iJD + 43200000) / 86400000);
        local_68.iJD = local_f8.iJD +
                       (int)((((uint)((ulong)((long)iVar9 * 0x92492493) >> 0x22) - (iVar9 >> 0x1f))
                              * 7 - iVar9) * 86400000 + 0xf731400);
        local_68.s = local_f8.s;
        local_68._42_6_ = SUB86(CONCAT44(local_f8._44_4_,local_f8._40_4_) >> 0x10,0);
        local_68.validYMD = '\0';
        local_68.validJD = local_c8.validJD;
        computeYMD(&local_68);
        local_c8.s = local_68.s;
        local_c8.iJD = local_68.iJD;
        local_c8.m = local_68.m;
        local_c8.tz = local_68.tz;
        local_c8._40_8_ = local_68._40_8_ & 0xffffffffffffff00;
        local_c8.M = 1;
        local_c8.Y = local_68.Y;
        local_c8.h = local_68.h;
        local_c8.D = 1;
        computeJD(&local_c8);
        uVar13 = (ulong)((int)(((local_68.iJD - local_c8.iJD) + 43200000) / 86400000) / 7 + 1);
        goto LAB_001a546c;
      case 'W':
        local_c8.tz = local_f8.tz;
        local_c8.m = local_f8.m;
        local_c8.s = local_f8.s;
        local_c8.iJD = local_f8.iJD;
        local_c8._40_8_ = CONCAT44(local_f8._44_4_,local_f8._40_4_) & 0xffffffffffffff00;
        local_c8.M = 1;
        local_c8.Y = local_f8.Y;
        local_c8.h = local_f8.h;
        local_c8.D = 1;
        computeJD(&local_c8);
        lVar15 = local_f8.iJD + 43200000;
        auVar3 = SEXT816(lVar15 - local_c8.iJD) * SEXT816(0x636ba875fd33dc87);
        iVar9 = (int)(auVar3._8_8_ >> 0x19) - (auVar3._12_4_ >> 0x1f);
LAB_001a521b:
        iVar14 = (int)(lVar15 / 86400000);
        iVar14 = (iVar14 / 7) * 7 - iVar14;
        iVar9 = (int)((ulong)((long)(iVar9 + iVar14 + 7) * -0x6db6db6d) >> 0x20) + iVar9 + iVar14 +
                7;
        uVar13 = (ulong)(uint)((iVar9 >> 2) - (iVar9 >> 0x1f));
        goto LAB_001a546c;
      case 'Y':
        uVar13 = (ulong)(uint)local_f8.Y;
        pcVar16 = "%04d";
        break;
      case 'd':
      case 'e':
        pcVar16 = "%2d";
        if (cVar1 == 'd') {
          pcVar16 = "%02d";
        }
        uVar13 = (ulong)(uint)local_f8.D;
        break;
      case 'f':
        uVar19 = 0x3b645a1d;
        if (local_f8.s <= 59.999) {
          uVar19 = SUB84(local_f8.s,0);
        }
        pcVar16 = "%06.3f";
LAB_001a54a6:
        sqlite3_str_appendf(&local_98,pcVar16,uVar19);
        goto LAB_001a54ad;
      case 'j':
        local_c8.tz = local_f8.tz;
        local_c8.m = local_f8.m;
        local_c8.s = local_f8.s;
        local_c8.iJD = local_f8.iJD;
        local_c8._40_8_ = CONCAT44(local_f8._44_4_,local_f8._40_4_) & 0xffffffffffffff00;
        local_c8.M = 1;
        local_c8.Y = local_f8.Y;
        local_c8.h = local_f8.h;
        local_c8.D = 1;
        computeJD(&local_c8);
        auVar3 = SEXT816((local_f8.iJD - local_c8.iJD) + 43200000) * SEXT816(0x636ba875fd33dc87);
        uVar13 = (ulong)(((int)(auVar3._8_8_ >> 0x19) - (auVar3._12_4_ >> 0x1f)) + 1);
        pcVar16 = "%03d";
        break;
      case 'm':
        uVar13 = (ulong)(uint)local_f8.M;
LAB_001a546c:
        pcVar16 = "%02d";
        break;
      case 's':
        if ((local_f8._44_4_ & 4) != 0) {
          uVar19 = SUB84((double)(local_f8.iJD + -0xbfc83e532200) / 1000.0,0);
          pcVar16 = "%.3f";
          goto LAB_001a54a6;
        }
        bVar5 = false;
        sqlite3_str_appendf(&local_98,"%lld",local_f8.iJD / 1000 + -0x3118a36940);
        goto LAB_001a54b2;
      case 'u':
      case 'w':
        iVar9 = (int)((local_f8.iJD + 0x7b98a00) / 86400000) % 7;
        cVar8 = (char)iVar9 + '0';
        c = cVar8;
        if (iVar9 == 0) {
          c = '7';
        }
        if (cVar1 != 'u') {
          c = cVar8;
        }
LAB_001a4fba:
        sqlite3_str_appendchar(&local_98,1,c);
LAB_001a54ad:
        bVar5 = false;
        goto LAB_001a54b2;
      default:
        if (cVar1 == '%') {
          c = '%';
          goto LAB_001a4fba;
        }
        goto switchD_001a4dd8_caseD_4b;
      }
      bVar5 = false;
      sqlite3_str_appendf(&local_98,pcVar16,uVar13);
LAB_001a54b2:
      if (bVar5) {
        return;
      }
      uVar13 = uVar12 + 1;
    }
    bVar5 = false;
    uVar12 = uVar13;
    if (*(char *)((long)pvVar10 + uVar13) != '\0') goto LAB_001a54b2;
    if (uVar18 < uVar13) {
      sqlite3_str_append(&local_98,(char *)((long)pvVar10 + uVar18),(int)uVar13 - (int)uVar18);
    }
    sqlite3ResultStrAccum(local_70,&local_98);
  }
  return;
switchD_001a4dd8_caseD_4b:
  uVar7 = local_98.printfFlags;
  if ((local_98._28_2_ & 0x400) != 0) {
    if (local_98.zText != (char *)0x0) {
      sqlite3DbFreeNN(local_98.db,local_98.zText);
    }
    local_98._28_2_ = CONCAT11(uVar7,local_98.accError) & 0xfbff;
  }
  local_98.nAlloc = 0;
  local_98.nChar = 0;
  local_98.zText = (char *)0x0;
  bVar5 = true;
  goto LAB_001a54b2;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  size_t i,j;
  sqlite3 *db;
  const char *zFmt;
  sqlite3_str sRes;


  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);

  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    char cf;
    if( zFmt[i]!='%' ) continue;
    if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
    i++;
    j = i + 1;
    cf = zFmt[i];
    switch( cf ){
      case 'd':  /* Fall thru */
      case 'e': {
        sqlite3_str_appendf(&sRes, cf=='d' ? "%02d" : "%2d", x.D);
        break;
      }
      case 'f': {  /* Fractional seconds.  (Non-standard) */
        double s = x.s;
        if( s>59.999 ) s = 59.999;
        sqlite3_str_appendf(&sRes, "%06.3f", s);
        break;
      }
      case 'F': {
        sqlite3_str_appendf(&sRes, "%04d-%02d-%02d", x.Y, x.M, x.D);
        break;
      }
      case 'G': /* Fall thru */
      case 'g': {
        DateTime y = x;
        assert( y.validJD );
        /* Move y so that it is the Thursday in the same week as x */
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        if( cf=='g' ){
          sqlite3_str_appendf(&sRes, "%02d", y.Y%100);
        }else{
          sqlite3_str_appendf(&sRes, "%04d", y.Y);
        }
        break;
      }
      case 'H':
      case 'k': {
        sqlite3_str_appendf(&sRes, cf=='H' ? "%02d" : "%2d", x.h);
        break;
      }
      case 'I': /* Fall thru */
      case 'l': {
        int h = x.h;
        if( h>12 ) h -= 12;
        if( h==0 ) h = 12;
        sqlite3_str_appendf(&sRes, cf=='I' ? "%02d" : "%2d", h);
        break;
      }
      case 'j': {  /* Day of year.  Jan01==1, Jan02==2, and so forth */
        sqlite3_str_appendf(&sRes,"%03d",daysAfterJan01(&x)+1);
        break;
      }
      case 'J': {  /* Julian day number.  (Non-standard) */
        sqlite3_str_appendf(&sRes,"%.16g",x.iJD/86400000.0);
        break;
      }
      case 'm': {
        sqlite3_str_appendf(&sRes,"%02d",x.M);
        break;
      }
      case 'M': {
        sqlite3_str_appendf(&sRes,"%02d",x.m);
        break;
      }
      case 'p': /* Fall thru */
      case 'P': {
        if( x.h>=12 ){
          sqlite3_str_append(&sRes, cf=='p' ? "PM" : "pm", 2);
        }else{
          sqlite3_str_append(&sRes, cf=='p' ? "AM" : "am", 2);
        }
        break;
      }
      case 'R': {
        sqlite3_str_appendf(&sRes, "%02d:%02d", x.h, x.m);
        break;
      }
      case 's': {
        if( x.useSubsec ){
          sqlite3_str_appendf(&sRes,"%.3f",
                (x.iJD - 21086676*(i64)10000000)/1000.0);
        }else{
          i64 iS = (i64)(x.iJD/1000 - 21086676*(i64)10000);
          sqlite3_str_appendf(&sRes,"%lld",iS);
        }
        break;
      }
      case 'S': {
        sqlite3_str_appendf(&sRes,"%02d",(int)x.s);
        break;
      }
      case 'T': {
        sqlite3_str_appendf(&sRes,"%02d:%02d:%02d", x.h, x.m, (int)x.s);
        break;
      }
      case 'u':    /* Day of week.  1 to 7.  Monday==1, Sunday==7 */
      case 'w': {  /* Day of week.  0 to 6.  Sunday==0, Monday==1 */
        char c = (char)daysAfterSunday(&x) + '0';
        if( c=='0' && cf=='u' ) c = '7';
        sqlite3_str_appendchar(&sRes, 1, c);
        break;
      }
      case 'U': {  /* Week num. 00-53. First Sun of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
              (daysAfterJan01(&x)-daysAfterSunday(&x)+7)/7);
        break;
      }
      case 'V': {  /* Week num. 01-53. First week with a Thur is week 01 */
        DateTime y = x;
        /* Adjust y so that is the Thursday in the same week as x */
        assert( y.validJD );
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        sqlite3_str_appendf(&sRes,"%02d", daysAfterJan01(&y)/7+1);
        break;
      }
      case 'W': {  /* Week num. 00-53. First Mon of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
           (daysAfterJan01(&x)-daysAfterMonday(&x)+7)/7);
        break;
      }
      case 'Y': {
        sqlite3_str_appendf(&sRes,"%04d",x.Y);
        break;
      }
      case '%': {
        sqlite3_str_appendchar(&sRes, 1, '%');
        break;
      }
      default: {
        sqlite3_str_reset(&sRes);
        return;
      }
    }
  }
  if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
  sqlite3ResultStrAccum(context, &sRes);
}